

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddRPathCheckRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  bool bVar1;
  cmMakefile *this_00;
  ostream *poVar2;
  undefined1 local_90 [8];
  string newRpath;
  cmComputeLinkInformation *cli;
  allocator local_51;
  string local_50;
  string *local_30;
  string *toDestDirPath_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  if (((this->ImportLibrary & 1U) == 0) &&
     (local_30 = toDestDirPath, toDestDirPath_local = config, config_local = (string *)os,
     os_local = (ostream *)this, this_local._4_4_ = indent.Level,
     bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config), bVar1)) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_51);
    bVar1 = cmMakefile::IsOn(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if ((!bVar1) &&
       (newRpath.field_2._8_8_ =
             cmGeneratorTarget::GetLinkInformation(this->Target,toDestDirPath_local),
       (cmComputeLinkInformation *)newRpath.field_2._8_8_ != (cmComputeLinkInformation *)0x0)) {
      cmComputeLinkInformation::GetChrpathString_abi_cxx11_
                ((string *)local_90,(cmComputeLinkInformation *)newRpath.field_2._8_8_);
      poVar2 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
      poVar2 = std::operator<<(poVar2,"file(RPATH_CHECK\n");
      poVar2 = ::operator<<(poVar2,(cmScriptGeneratorIndent)this_local._4_4_);
      poVar2 = std::operator<<(poVar2,"     FILE \"");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\"\n");
      poVar2 = ::operator<<(poVar2,(cmScriptGeneratorIndent)this_local._4_4_);
      poVar2 = std::operator<<(poVar2,"     RPATH \"");
      poVar2 = std::operator<<(poVar2,(string *)local_90);
      std::operator<<(poVar2,"\")\n");
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRPathCheckRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }
  // Skip if on Apple
  if (this->Target->Target->GetMakefile()->IsOn(
        "CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  // Get the install RPATH from the link information.
  std::string newRpath = cli->GetChrpathString();

  // Write a rule to remove the installed file if its rpath is not the
  // new rpath.  This is needed for existing build/install trees when
  // the installed rpath changes but the file is not rebuilt.
  /* clang-format off */
  os << indent << "file(RPATH_CHECK\n"
     << indent << "     FILE \"" << toDestDirPath << "\"\n"
     << indent << "     RPATH \"" << newRpath << "\")\n";
  /* clang-format on */
}